

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O0

void __thiscall Planner::Planner(Planner *this,Vec3i World_Size_)

{
  initializer_list<Vec3i> __l;
  Vec3i local_1b0 [26];
  iterator local_78;
  undefined8 local_70;
  _func_double_Vec3i_Vec3i *local_58;
  function<double_(Vec3i,_Vec3i)> local_50;
  Planner *local_30;
  Planner *this_local;
  int local_20;
  Planner *local_18;
  Vec3i World_Size__local;
  
  local_20 = World_Size_.z;
  this_local = World_Size_._0_8_;
  this->_vptr_Planner = (_func_int **)&PTR__Planner_001c0150;
  local_30 = this;
  local_18 = this_local;
  World_Size__local.x = local_20;
  std::function<double_(Vec3i,_Vec3i)>::function(&this->heuristic);
  std::vector<Vec3i,_std::allocator<Vec3i>_>::vector(&this->direction);
  std::vector<Vec3i,_std::allocator<Vec3i>_>::vector(&this->walls);
  local_58 = Euclidean;
  std::function<double(Vec3i,Vec3i)>::function<double(*)(Vec3i,Vec3i),void>
            ((function<double(Vec3i,Vec3i)> *)&local_50,&local_58);
  Set_Heuristic(this,&local_50);
  std::function<double_(Vec3i,_Vec3i)>::~function(&local_50);
  memcpy(local_1b0,&DAT_0019b7b8,0x138);
  local_70 = 0x1a;
  __l._M_len = 0x1a;
  __l._M_array = local_1b0;
  local_78 = local_1b0;
  std::vector<Vec3i,_std::allocator<Vec3i>_>::operator=(&this->direction,__l);
  *(Planner **)&this->World_Size = local_18;
  (this->World_Size).z = World_Size__local.x;
  return;
}

Assistant:

Planner::Planner(Vec3i World_Size_) {
  Set_Heuristic(&Planner::Euclidean);  ///< Set default heuristic to Euclidean
  direction = {
    { 0 , 0 , 1}, {0 , 1, 0}, {1, 0, 0}, {0, 0, -1},
    { 0, -1, 0}, {-1, 0, 0}, {0 , 1, 1}, {1, 0, 1},
    { 1, 1, 0}, {0, -1, -1}, {-1, 0, -1}, {-1, -1, 0},
    { 0, 1, -1}, {0, -1, 1}, {1, 0, -1}, {-1, 0, 1},
    { 1, -1, 0}, {-1, 1, 0}, {1, 1, -1}, {1, -1, 1},
    { -1, 1, 1}, {1, -1, -1}, {-1, -1, 1}, {-1, 1, -1},
    { 1, 1, 1}, {-1, -1, -1}
  };
  World_Size = World_Size_;
}